

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t2(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int unaff_retaddr;
  int oc;
  int rr;
  int r;
  int f;
  int dc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff4;
  int in_stack_fffffffffffffffc;
  
  printf("PWM dutycycle/range/frequency tests.\n");
  gpioSetPWMrange(0x19,0xff);
  gpioSetPWMfrequency(0x19,0);
  iVar1 = gpioGetPWMfrequency(0x19);
  CHECK(oc,unaff_retaddr,in_stack_fffffffffffffffc,iVar1,in_stack_fffffffffffffff4,
        (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  t2_count = 0;
  gpioSetAlertFunc(0x19,t2cb);
  gpioPWM(0x19,0);
  iVar2 = gpioGetPWMdutycycle(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar1,in_stack_fffffffffffffff4,
        (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  time_sleep(0x3fe0000000000000);
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  iVar3 = t2_count - iVar1;
  CHECK(oc,unaff_retaddr,iVar2,iVar3,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioPWM(0x19,0x80);
  iVar2 = gpioGetPWMdutycycle(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  CHECK(oc,unaff_retaddr,iVar2,t2_count - iVar1,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioSetPWMfrequency(0x19,100);
  iVar3 = gpioGetPWMfrequency(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  CHECK(oc,unaff_retaddr,iVar2,t2_count - iVar1,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioSetPWMfrequency(0x19,1000);
  iVar3 = gpioGetPWMfrequency(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  iVar1 = t2_count;
  time_sleep(0x4000000000000000);
  iVar3 = t2_count - iVar1;
  CHECK(oc,unaff_retaddr,iVar2,iVar3,in_stack_fffffffffffffff4,
        (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  iVar4 = gpioGetPWMrange(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,iVar4,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioGetPWMrealRange(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,iVar4,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioSetPWMrange(0x19,2000);
  iVar4 = gpioGetPWMrange(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,iVar4,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioGetPWMrealRange(0x19);
  CHECK(oc,unaff_retaddr,iVar2,iVar3,iVar4,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  gpioPWM(0x19,0);
  return;
}

Assistant:

void t2()
{
   int dc, f, r, rr, oc;

   printf("PWM dutycycle/range/frequency tests.\n");

   gpioSetPWMrange(GPIO, 255);
   gpioSetPWMfrequency(GPIO, 0);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(2, 1, f, 10, 0, "set PWM range, set/get PWM frequency");

   t2_count=0;

   gpioSetAlertFunc(GPIO, t2cb);

   gpioPWM(GPIO, 0);
   dc = gpioGetPWMdutycycle(GPIO);
   CHECK(2, 2, dc, 0, 0, "get PWM dutycycle");

   time_sleep(0.5); /* allow old notifications to flush */
   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 3, f, 0, 0, "set PWM dutycycle, callback");

   gpioPWM(GPIO, 128);
   dc = gpioGetPWMdutycycle(GPIO);
   CHECK(2, 4, dc, 128, 0, "get PWM dutycycle");

   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 5, f, 40, 5, "set PWM dutycycle, callback");

   gpioSetPWMfrequency(GPIO, 100);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(2, 6, f, 100, 0, "set/get PWM frequency");

   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 7, f, 400, 1, "callback");

   gpioSetPWMfrequency(GPIO, 1000);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(2, 8, f, 1000, 0, "set/get PWM frequency");

   oc = t2_count;
   time_sleep(2);
   f = t2_count - oc;
   CHECK(2, 9, f, 4000, 1, "callback");

   r = gpioGetPWMrange(GPIO);
   CHECK(2, 10, r, 255, 0, "get PWM range");

   rr = gpioGetPWMrealRange(GPIO);
   CHECK(2, 11, rr, 200, 0, "get PWM real range");

   gpioSetPWMrange(GPIO, 2000);
   r = gpioGetPWMrange(GPIO);
   CHECK(2, 12, r, 2000, 0, "set/get PWM range");

   rr = gpioGetPWMrealRange(GPIO);
   CHECK(2, 13, rr, 200, 0, "get PWM real range");

   gpioPWM(GPIO, 0);
}